

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O1

bool __thiscall
qpdf::Stream::filterable
          (Stream *this,
          vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          *filters,bool *specialized_compression,bool *lossy_compression)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Members *pMVar8;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 extraout_var_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  const_iterator cVar10;
  iterator iVar11;
  pointer psVar12;
  byte bVar13;
  key_type *__k;
  uint uVar14;
  ulong uVar15;
  QPDFObjectHandle *key;
  uint uVar16;
  long lVar17;
  QPDFObjectHandle decode_obj;
  QPDFObjectHandle filter_obj;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> decode_parms;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filter_names;
  string local_e8;
  uint local_c4;
  vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
  *local_c0;
  QPDFObjectHandle local_b8;
  QPDFObjectHandle local_a8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Stream *local_50;
  bool *local_48;
  string *local_40;
  bool *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  local_c0 = (vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
              *)filters;
  local_50 = this;
  local_48 = specialized_compression;
  local_38 = lossy_compression;
  pMVar8 = stream(this);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/Filter","");
  key = &pMVar8->stream_dict;
  QPDFObjectHandle::getKey(&local_a8,(string *)key);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = QPDFObjectHandle::isNull(&local_a8);
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT71(extraout_var,bVar3);
  local_40 = (string *)key;
  if (bVar3) {
LAB_00200c1e:
    pbVar2 = local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar16 = (uint)CONCAT71((int7)((ulong)paVar9 >> 8),1);
    for (__k = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; local_c4 = uVar16, __k != pbVar2;
        __k = __k + 1) {
      cVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&filter_abbreviations_abi_cxx11_._M_t,__k);
      if ((_Rb_tree_header *)cVar10._M_node !=
          &filter_abbreviations_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&filter_abbreviations_abi_cxx11_,__k);
        std::__cxx11::string::_M_assign((string *)__k);
      }
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>_>
               ::find(&filter_factories_abi_cxx11_._M_t,__k);
      if ((_Rb_tree_header *)iVar11._M_node ==
          &filter_factories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        local_c4 = 0;
      }
      else {
        if (iVar11._M_node[2]._M_left == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        (*(code *)iVar11._M_node[2]._M_right)(&local_e8,iVar11._M_node + 2);
        std::
        vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
        ::emplace_back<std::shared_ptr<QPDFStreamFilter>>
                  (local_c0,(shared_ptr<QPDFStreamFilter> *)&local_e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
        }
      }
      uVar16 = local_c4;
    }
    if ((uVar16 & 1) != 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"/DecodeParms","");
      QPDFObjectHandle::getKey(&local_b8,local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar3 = QPDFObjectHandle::isArray(&local_b8);
      if ((bVar3) && (iVar6 = QPDFObjectHandle::getArrayNItems(&local_b8), iVar6 == 0)) {
        QPDFObjectHandle::newNull();
        this_02._M_pi =
             local_b8.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length;
        local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_e8._M_dataplus._M_p;
        local_e8._M_dataplus._M_p = (pointer)0x0;
        local_e8._M_string_length = 0;
        if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
        }
      }
      bVar3 = QPDFObjectHandle::isArray(&local_b8);
      if (bVar3) {
        for (iVar6 = 0; iVar7 = QPDFObjectHandle::getArrayNItems(&local_b8), iVar6 < iVar7;
            iVar6 = iVar6 + 1) {
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_e8,(int)&local_b8);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>(&local_98,(QPDFObjectHandle *)&local_e8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_string_length);
          }
        }
      }
      else if (local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start) {
        uVar15 = 1;
        do {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&local_98,&local_b8);
          bVar3 = uVar15 < (ulong)((long)local_78.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_78.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar3);
      }
      if ((*(pointer *)(local_c0 + 8) != *(pointer *)local_c0) &&
         ((long)local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start !=
          (long)*(pointer *)(local_c0 + 8) - (long)*(pointer *)local_c0)) {
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e8,"stream /DecodeParms length is inconsistent with filters","")
        ;
        warn(local_50,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        uVar16 = 0;
      }
      if ((uVar16 & 1) == 0) {
        uVar16 = 0;
      }
      else {
        psVar12 = *(pointer *)local_c0;
        local_c4 = uVar16;
        if (*(pointer *)(local_c0 + 8) != psVar12) {
          lVar17 = 8;
          uVar15 = 0;
          do {
            plVar1 = *(long **)((long)psVar12 + lVar17 + -8);
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&(psVar12->
                               super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar17);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            if ((ulong)((long)local_98.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_98.
                              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar15) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar15);
            }
            local_60 = *(undefined8 *)
                        ((long)local_98.
                               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
            this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&((local_98.
                                 super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).obj.
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       lVar17);
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_01->_M_use_count = this_01->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_01->_M_use_count = this_01->_M_use_count + 1;
              }
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  this_01->_M_use_count = this_01->_M_use_count + 1;
                }
              }
            }
            local_58 = this_01;
            cVar5 = (**(code **)(*plVar1 + 0x10))(plVar1,&local_60);
            if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
            }
            if (cVar5 == '\0') {
              local_c4 = 0;
            }
            else {
              cVar5 = (**(code **)(*plVar1 + 0x20))(plVar1);
              if (cVar5 != '\0') {
                *local_48 = true;
              }
              cVar5 = (**(code **)(*plVar1 + 0x28))(plVar1);
              if (cVar5 != '\0') {
                *local_48 = true;
                *local_38 = true;
              }
            }
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            uVar15 = uVar15 + 1;
            psVar12 = *(pointer *)local_c0;
            lVar17 = lVar17 + 0x10;
            uVar16 = local_c4;
          } while (uVar15 < (ulong)((long)*(pointer *)(local_c0 + 8) - (long)psVar12 >> 4));
        }
      }
      bVar13 = (byte)uVar16;
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_98);
      if (local_b8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      goto LAB_0020107f;
    }
  }
  else {
    bVar3 = QPDFObjectHandle::isName(&local_a8);
    if (bVar3) {
      QPDFObjectHandle::getName_abi_cxx11_(&local_e8,&local_a8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                 &local_e8);
      paVar9 = &local_e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar9) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        paVar9 = extraout_RAX;
      }
      goto LAB_00200c1e;
    }
    bVar3 = QPDFObjectHandle::isArray(&local_a8);
    if (bVar3) {
      uVar16 = QPDFObjectHandle::getArrayNItems(&local_a8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(ulong)uVar16;
      if (0 < (int)uVar16) {
        bVar3 = true;
        uVar14 = 0;
        do {
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_98,(int)&local_a8);
          bVar4 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_98);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71(extraout_var_00,bVar4);
          if (bVar4) {
            QPDFObjectHandle::getName_abi_cxx11_(&local_e8,(QPDFObjectHandle *)&local_98);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_78,&local_e8);
            paVar9 = &local_e8.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar9) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
              paVar9 = extraout_RAX_00;
            }
          }
          else {
            bVar3 = false;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_98.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_98.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            paVar9 = extraout_RAX_01;
          }
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
        if (!bVar3) goto LAB_00201034;
      }
      goto LAB_00200c1e;
    }
LAB_00201034:
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"stream filter type is not name or array","");
    warn(local_50,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
  }
  bVar13 = 0;
LAB_0020107f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return (bool)(bVar13 & 1);
}

Assistant:

bool
Stream::filterable(
    std::vector<std::shared_ptr<QPDFStreamFilter>>& filters,
    bool& specialized_compression,
    bool& lossy_compression)
{
    auto s = stream();
    // Check filters

    QPDFObjectHandle filter_obj = s->stream_dict.getKey("/Filter");
    bool filters_okay = true;

    std::vector<std::string> filter_names;

    if (filter_obj.isNull()) {
        // No filters
    } else if (filter_obj.isName()) {
        // One filter
        filter_names.push_back(filter_obj.getName());
    } else if (filter_obj.isArray()) {
        // Potentially multiple filters
        int n = filter_obj.getArrayNItems();
        for (int i = 0; i < n; ++i) {
            QPDFObjectHandle item = filter_obj.getArrayItem(i);
            if (item.isName()) {
                filter_names.push_back(item.getName());
            } else {
                filters_okay = false;
            }
        }
    } else {
        filters_okay = false;
    }

    if (!filters_okay) {
        QTC::TC("qpdf", "QPDF_Stream invalid filter");
        warn("stream filter type is not name or array");
        return false;
    }

    bool filterable = true;

    for (auto& filter_name: filter_names) {
        if (filter_abbreviations.count(filter_name)) {
            QTC::TC("qpdf", "QPDF_Stream expand filter abbreviation");
            filter_name = filter_abbreviations[filter_name];
        }

        auto ff = filter_factories.find(filter_name);
        if (ff == filter_factories.end()) {
            filterable = false;
        } else {
            filters.push_back((ff->second)());
        }
    }

    if (!filterable) {
        return false;
    }

    // filters now contains a list of filters to be applied in order. See which ones we can support.

    // See if we can support any decode parameters that are specified.

    QPDFObjectHandle decode_obj = s->stream_dict.getKey("/DecodeParms");
    std::vector<QPDFObjectHandle> decode_parms;
    if (decode_obj.isArray() && (decode_obj.getArrayNItems() == 0)) {
        decode_obj = QPDFObjectHandle::newNull();
    }
    if (decode_obj.isArray()) {
        for (int i = 0; i < decode_obj.getArrayNItems(); ++i) {
            decode_parms.push_back(decode_obj.getArrayItem(i));
        }
    } else {
        for (unsigned int i = 0; i < filter_names.size(); ++i) {
            decode_parms.push_back(decode_obj);
        }
    }

    // Ignore /DecodeParms entirely if /Filters is empty.  At least one case of a file whose
    // /DecodeParms was [ << >> ] when /Filters was empty has been seen in the wild.
    if ((filters.size() != 0) && (decode_parms.size() != filters.size())) {
        warn("stream /DecodeParms length is inconsistent with filters");
        filterable = false;
    }

    if (!filterable) {
        return false;
    }

    for (size_t i = 0; i < filters.size(); ++i) {
        auto filter = filters.at(i);
        auto decode_item = decode_parms.at(i);

        if (filter->setDecodeParms(decode_item)) {
            if (filter->isSpecializedCompression()) {
                specialized_compression = true;
            }
            if (filter->isLossyCompression()) {
                specialized_compression = true;
                lossy_compression = true;
            }
        } else {
            filterable = false;
        }
    }

    return filterable;
}